

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O2

void nfa_closure(DFAState *x)

{
  NFAState **ppNVar1;
  uint uVar2;
  NFAState *pNVar3;
  NFAState *pNVar4;
  ulong uVar5;
  NFAState **__base;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = 0;
  do {
    uVar6 = (ulong)(x->states).n;
    __base = (x->states).v;
    if (uVar6 <= uVar7) {
      if (__base == (NFAState **)0x0) {
        return;
      }
      qsort(__base,uVar6,8,nfacmp);
      return;
    }
    pNVar3 = __base[uVar7];
    pNVar4 = pNVar3;
    for (uVar6 = 0; uVar6 < (pNVar4->epsilon).n; uVar6 = uVar6 + 1) {
      uVar2 = (x->states).n;
      uVar5 = 0;
      do {
        if (uVar2 == uVar5) {
          if (__base == (x->states).e) {
            if (2 < uVar2) goto LAB_0013db0d;
          }
          else if ((uVar2 & 7) == 0) {
LAB_0013db0d:
            vec_add_internal(x,(pNVar3->epsilon).v[uVar6]);
            break;
          }
          pNVar4 = (pNVar3->epsilon).v[uVar6];
          (x->states).n = uVar2 + 1;
          __base[uVar2] = pNVar4;
          break;
        }
        ppNVar1 = __base + uVar5;
        uVar5 = uVar5 + 1;
      } while ((pNVar4->epsilon).v[uVar6] != *ppNVar1);
      __base = (x->states).v;
      pNVar4 = __base[uVar7];
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static void nfa_closure(DFAState *x) {
  uint i, j, k;

  for (i = 0; i < x->states.n; i++) {
    NFAState *s = x->states.v[i];
    for (j = 0; j < x->states.v[i]->epsilon.n; j++) {
      for (k = 0; k < x->states.n; k++)
        if (x->states.v[i]->epsilon.v[j] == x->states.v[k]) goto Lbreak;
      vec_add(&x->states, s->epsilon.v[j]);
    Lbreak:;
    }
  }
  if (x->states.v != NULL) qsort(x->states.v, x->states.n, sizeof(x->states.v[0]), nfacmp);
}